

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

bool rr::isValidVertexAttrib(VertexAttrib *vertexAttrib)

{
  bool bVar1;
  VertexAttrib *vertexAttrib_local;
  
  bVar1 = de::inBounds<int>(vertexAttrib->type,0,0x23);
  if (((bVar1) && (bVar1 = de::inRange<int>(vertexAttrib->size,0,4), bVar1)) &&
     (-1 < vertexAttrib->instanceDivisor)) {
    if ((vertexAttrib->pointer == (void *)0x0) && (vertexAttrib->type != VERTEXATTRIBTYPE_DONT_CARE)
       ) {
      vertexAttrib_local._7_1_ = false;
    }
    else if ((((vertexAttrib->type == VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV) ||
              ((vertexAttrib->type == VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV ||
               (vertexAttrib->type == VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV)))) ||
             ((vertexAttrib->type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP ||
              ((((vertexAttrib->type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE ||
                 (vertexAttrib->type == VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA)) ||
                (vertexAttrib->type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA)) ||
               (vertexAttrib->type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA))))))
            && (vertexAttrib->size != 4)) {
      vertexAttrib_local._7_1_ = false;
    }
    else {
      vertexAttrib_local._7_1_ = true;
    }
  }
  else {
    vertexAttrib_local._7_1_ = false;
  }
  return vertexAttrib_local._7_1_;
}

Assistant:

bool isValidVertexAttrib (const VertexAttrib& vertexAttrib)
{
	// Trivial range checks.
	if (!de::inBounds<int>(vertexAttrib.type, 0, VERTEXATTRIBTYPE_LAST) ||
		!de::inRange(vertexAttrib.size, 0, 4) ||
		vertexAttrib.instanceDivisor < 0)
		return false;

	// Generic attributes
	if (!vertexAttrib.pointer && vertexAttrib.type != VERTEXATTRIBTYPE_DONT_CARE)
		return false;

	// Packed formats
	if ((vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV				||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV				||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV				||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP		||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE		||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA		||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA	||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA)	&&
		vertexAttrib.size != 4)
		return false;

	return true;
}